

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

string * __thiscall
gl3cts::InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *this,
          _test_iteration iteration)

{
  char *pcVar1;
  ostream *poVar2;
  TestError *this_00;
  char *pcVar3;
  string type_string;
  stringstream result_sstream;
  char *local_1e8;
  char *local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  long *local_1c8 [2];
  long local_1b8 [2];
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (iteration < TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    local_1e0 = (char *)0x0;
    local_1d8 = '\0';
    pcVar3 = "mix_vec4_bvec4";
    if (iteration == TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC3) {
      pcVar3 = "mix_vec3_bvec3";
    }
    pcVar1 = "mix_vec2_bvec2";
    if (iteration != TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC2) {
      pcVar1 = pcVar3;
    }
    local_1e8 = &local_1d8;
    std::__cxx11::string::_M_replace((ulong)&local_1e8,0,(char *)0x0,(ulong)(pcVar1 + 9));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"#version 140\n\nvoid main()\n{\n    if (!",0x25);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1e8,(long)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "(false))\n    {\n        gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n    }\n    else\n    {\n        gl_Position = vec4(2.0, 3.0, 4.0, 5.0);\n    }\n}\n"
               ,0x8c);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  else {
    if (1 < iteration - TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized test iteration type",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                 ,0x48b);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_1e0 = (char *)0x0;
    local_1d8 = '\0';
    local_1e8 = &local_1d8;
    std::__cxx11::stringstream::stringstream(local_1a8);
    pcVar3 = "not";
    if (iteration == TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) {
      pcVar3 = "all";
    }
    std::__cxx11::string::_M_replace((ulong)&local_1e8,0,local_1e0,(ulong)pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"#version 140\n\nvoid main()\n{\n    gl_Position = vec4(",0x33);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,local_1e8,(long)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"(false, true) ? 1.0 : 2.0);\n}\n",0x1e);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0],local_1b8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    if (local_1e8 != &local_1d8) {
      operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::getShaderBody(_test_iteration iteration) const
{
	std::string result;

	switch (iteration)
	{
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC2:
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC3:
	case TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC4:
	{
		/* From GL SL spec:
		 *
		 * The logical unary operator not (!). It operates only on a Boolean expression and results in a Boolean
		 * expression. To operate on a vector, use the built-in function not.
		 */
		std::stringstream result_sstream;
		std::string		  type_string;

		type_string = (iteration == TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC2) ?
						  "bvec2" :
						  (iteration == TEST_ITERATION_EXCL_MARK_OP_MUST_NOT_ACCEPT_BVEC3) ? "bvec3" : "bvec4";

		result_sstream << "#version 140\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    if (!"
					   << type_string << "(false))\n"
										 "    {\n"
										 "        gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n"
										 "    }\n"
										 "    else\n"
										 "    {\n"
										 "        gl_Position = vec4(2.0, 3.0, 4.0, 5.0);\n"
										 "    }\n"
										 "}\n";

		result = result_sstream.str();
		break;
	}

	case TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL:
	case TEST_ITERATION_NOT_FUNC_MUST_NOT_ACCEPT_BOOL:
	{
		std::string		  op_string;
		std::stringstream result_sstream;

		/* From GLSL spec, all() and not() functions are defined as:
		 *
		 * bool all(bvec x)
		 * bvec not(bvec x)
		 *
		 * where bvec is bvec2, bvec3 or bvec4.
		 */
		op_string = (iteration == TEST_ITERATION_ALL_FUNC_MUST_NOT_ACCEPT_BOOL) ? "all" : "not";

		result_sstream << "#version 140\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4("
					   << op_string << "(false, true) ? 1.0 : 2.0);\n"
									   "}\n";

		result = result_sstream.str();
		break;
	}

	default:
		TCU_FAIL("Unrecognized test iteration type");
	} /* switch (iteration) */

	return result;
}